

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpoint_set.c
# Opt level: O2

int mpt_fpoint_set(mpt_fpoint *pt,mpt_convertable *src,mpt_range *r)

{
  int iVar1;
  uint uVar2;
  mpt_fpoint tmp;
  mpt_iterator *it;
  
  tmp.x = 0.0;
  tmp.y = 0.0;
  if (src == (mpt_convertable *)0x0) {
    tmp.x = 0.0;
    tmp.y = 0.0;
    iVar1 = 0;
  }
  else {
    it = (mpt_iterator *)0x0;
    iVar1 = (*src->_vptr->convert)(src,0x86,&it);
    if (iVar1 < 0) {
      uVar2 = mpt_fpoint_typeid();
      if ((int)uVar2 < 1) {
        return -3;
      }
      iVar1 = (*src->_vptr->convert)(src,(ulong)uVar2,&tmp);
      if (iVar1 < 0) {
        return -3;
      }
    }
    else {
      iVar1 = mpt_iterator_consume(it,0x66,&tmp);
      if (iVar1 < 0) {
        return iVar1;
      }
      if (iVar1 == 0) {
        tmp.y = tmp.x;
        iVar1 = 1;
      }
      else {
        iVar1 = mpt_iterator_consume(it,0x66,&tmp.y);
        if (iVar1 < 0) {
          return iVar1;
        }
        iVar1 = 2;
      }
    }
    if (r != (mpt_range *)0x0) {
      if ((double)tmp.x < r->min) {
        return -2;
      }
      if ((double)tmp.y < r->min) {
        return -2;
      }
      if (r->max < (double)tmp.x) {
        return -2;
      }
      if (r->max < (double)tmp.y) {
        return -2;
      }
    }
  }
  *pt = tmp;
  return iVar1;
}

Assistant:

extern int mpt_fpoint_set(MPT_STRUCT(fpoint) *pt, MPT_INTERFACE(convertable) *src, const MPT_STRUCT(range) *r)
{
	MPT_INTERFACE(iterator) *it;
	MPT_STRUCT(fpoint) tmp = { 0.0, 0.0 };
	int ret;
	
	if (!src) {
		*pt = tmp;
		return 0;
	}
	it = 0;
	if ((ret = src->_vptr->convert(src, MPT_ENUM(TypeIteratorPtr), &it)) < 0) {
		int type = mpt_fpoint_typeid();
		if (type <= 0 || (ret = src->_vptr->convert(src, type, &tmp)) < 0) {
			return MPT_ERROR(BadType);
		}
	}
	else {
		/* first coordinate */
		if ((ret = mpt_iterator_consume(it, 'f', &tmp.x)) < 0) {
			return ret;
		}
		if (!ret) {
			ret = 1;
			tmp.y = tmp.x;
		}
		else if ((ret = mpt_iterator_consume(it, 'f', &tmp.y)) < 0) {
			return ret;
		}
		else {
			ret = 2;
		}
	}
	if (r) {
		if (tmp.x < r->min || tmp.y < r->min
		 || tmp.x > r->max || tmp.y > r->max) {
			return MPT_ERROR(BadValue);
		}
	}
	*pt = tmp;
	return ret;
}